

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManSpecBuild(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int fDualOut,
                     int fSpeculate,Vec_Int_t *vTrace,Vec_Int_t *vGuide,Vec_Int_t *vMap)

{
  int iVar1;
  int j;
  uint iLit1;
  Gia_Obj_t *pObj_00;
  
  iVar1 = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,iVar1);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    return;
  }
  if (fDualOut != 0) {
    iVar1 = Gia_ObjId(p,pObj);
    j = Gia_ObjId(p,pObj_00);
    iVar1 = Gia_ObjDiffColors2(p,iVar1,j);
    if (iVar1 == 0) {
      return;
    }
  }
  iLit1 = Abc_LitNotCond(pObj_00->Value,
                         ((uint)pObj_00 ^ (uint)pObj) & 1 ^
                         (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f) ^
                         (uint)((ulong)*(undefined8 *)((ulong)pObj_00 & 0xfffffffffffffffe) >> 0x3f)
                        );
  if ((pObj->Value == iLit1) ||
     (iVar1 = Gia_ObjId(p,pObj), (p->pReprs[iVar1].field_0x3 & 0x10) != 0)) {
    if (vTrace == (Vec_Int_t *)0x0) goto LAB_001e6b75;
    iVar1 = 0;
    vXorLits = vTrace;
  }
  else {
    if (vTrace != (Vec_Int_t *)0x0) {
      Vec_IntPush(vTrace,1);
    }
    if ((vGuide != (Vec_Int_t *)0x0) &&
       (iVar1 = Vec_IntEntry(vGuide,vTrace->nSize + -1), iVar1 == 0)) goto LAB_001e6b75;
    if (vMap != (Vec_Int_t *)0x0) {
      iVar1 = Gia_ObjId(p,pObj);
      Vec_IntPush(vMap,iVar1);
    }
    iVar1 = Gia_ManHashXor(pNew,pObj->Value,iLit1);
  }
  Vec_IntPush(vXorLits,iVar1);
LAB_001e6b75:
  if (fSpeculate != 0) {
    pObj->Value = iLit1;
  }
  return;
}

Assistant:

static inline void Gia_ManSpecBuild( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int fDualOut, int fSpeculate, Vec_Int_t * vTrace, Vec_Int_t * vGuide, Vec_Int_t * vMap )
{
    Gia_Obj_t * pRepr;
    unsigned iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( pObj->Value != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
    {
        if ( vTrace )
            Vec_IntPush( vTrace, 1 );
        if ( vGuide == NULL || Vec_IntEntry( vGuide, Vec_IntSize(vTrace)-1 ) )
        {
            if ( vMap )  
                Vec_IntPush( vMap, Gia_ObjId(p, pObj) );
            Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, pObj->Value, iLitNew) );
        }
    }
    else
    {
        if ( vTrace )
            Vec_IntPush( vTrace, 0 );
    }
    if ( fSpeculate )
        pObj->Value = iLitNew;
}